

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

N_Vector N_VMake_Serial(sunindextype length,realtype *v_data)

{
  N_Vector v;
  realtype *v_data_local;
  sunindextype length_local;
  
  length_local = (sunindextype)N_VNewEmpty_Serial(length);
  if ((N_Vector)length_local == (N_Vector)0x0) {
    length_local = 0;
  }
  else if (0 < length) {
    *(undefined4 *)((long)((N_Vector)length_local)->content + 8) = 0;
    *(realtype **)((long)((N_Vector)length_local)->content + 0x10) = v_data;
  }
  return (N_Vector)length_local;
}

Assistant:

N_Vector N_VMake_Serial(sunindextype length, realtype *v_data)
{
  N_Vector v;

  v = NULL;
  v = N_VNewEmpty_Serial(length);
  if (v == NULL) return(NULL);

  if (length > 0) {
    /* Attach data */
    NV_OWN_DATA_S(v) = SUNFALSE;
    NV_DATA_S(v)     = v_data;
  }

  return(v);
}